

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTDMT_freeBufferPool(ZSTDMT_bufferPool *bufPool)

{
  ZSTD_freeFunction UNRECOVERED_JUMPTABLE;
  ulong uVar1;
  buffer_t *pbVar2;
  
  if (bufPool == (ZSTDMT_bufferPool *)0x0) {
    return;
  }
  pbVar2 = bufPool->bTable;
  for (uVar1 = 0; uVar1 < bufPool->totalBuffers; uVar1 = uVar1 + 1) {
    ZSTD_free(pbVar2->start,bufPool->cMem);
    pbVar2 = pbVar2 + 1;
  }
  pthread_mutex_destroy((pthread_mutex_t *)bufPool);
  UNRECOVERED_JUMPTABLE = (bufPool->cMem).customFree;
  if (UNRECOVERED_JUMPTABLE != (ZSTD_freeFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)((bufPool->cMem).opaque,bufPool);
    return;
  }
  free(bufPool);
  return;
}

Assistant:

static void ZSTDMT_freeBufferPool(ZSTDMT_bufferPool* bufPool)
{
    unsigned u;
    DEBUGLOG(3, "ZSTDMT_freeBufferPool (address:%08X)", (U32)(size_t)bufPool);
    if (!bufPool) return;   /* compatibility with free on NULL */
    for (u=0; u<bufPool->totalBuffers; u++) {
        DEBUGLOG(4, "free buffer %2u (address:%08X)", u, (U32)(size_t)bufPool->bTable[u].start);
        ZSTD_free(bufPool->bTable[u].start, bufPool->cMem);
    }
    ZSTD_pthread_mutex_destroy(&bufPool->poolMutex);
    ZSTD_free(bufPool, bufPool->cMem);
}